

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O2

UChar32 __thiscall
icu_63::UTF16CollationIterator::previousCodePoint(UTF16CollationIterator *this,UErrorCode *param_1)

{
  UChar UVar1;
  UChar UVar2;
  UChar *pUVar3;
  uint uVar4;
  
  pUVar3 = this->pos;
  if (pUVar3 != this->start) {
    this->pos = pUVar3 + -1;
    UVar1 = pUVar3[-1];
    uVar4 = (uint)(ushort)UVar1;
    if ((pUVar3 + -1 != this->start && ((ushort)UVar1 & 0xfc00) == 0xdc00) &&
       (UVar2 = pUVar3[-2], (UVar2 & 0xfc00U) == 0xd800)) {
      this->pos = pUVar3 + -2;
      uVar4 = (uint)(ushort)UVar1 + (uint)(ushort)UVar2 * 0x400 + 0xfca02400;
    }
    return uVar4;
  }
  return -1;
}

Assistant:

UChar32
UTF16CollationIterator::previousCodePoint(UErrorCode & /*errorCode*/) {
    if(pos == start) {
        return U_SENTINEL;
    }
    UChar32 c = *--pos;
    UChar lead;
    if(U16_IS_TRAIL(c) && pos != start && U16_IS_LEAD(lead = *(pos - 1))) {
        --pos;
        return U16_GET_SUPPLEMENTARY(lead, c);
    } else {
        return c;
    }
}